

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

void __thiscall
absl::strings_internal::BigUnsigned<84>::BigUnsigned(BigUnsigned<84> *this,string_view sv)

{
  char *end;
  int n;
  char *pcVar1;
  char *pcVar2;
  char *begin;
  ulong uVar3;
  long lVar4;
  
  begin = sv._M_str;
  uVar3 = sv._M_len;
  end = begin + uVar3;
  memset(this,0,0x154);
  pcVar1 = begin;
  if (0 < (long)uVar3 >> 2) {
    pcVar1 = begin + (uVar3 & 0xfffffffffffffffc);
    lVar4 = ((long)uVar3 >> 2) + 1;
    pcVar2 = begin + 3;
    do {
      if (9 < (byte)(pcVar2[-3] - 0x30U)) {
        pcVar2 = pcVar2 + -3;
        goto LAB_001a89df;
      }
      if (9 < (byte)(pcVar2[-2] - 0x30U)) {
        pcVar2 = pcVar2 + -2;
        goto LAB_001a89df;
      }
      if (9 < (byte)(pcVar2[-1] - 0x30U)) {
        pcVar2 = pcVar2 + -1;
        goto LAB_001a89df;
      }
      if (9 < (byte)(*pcVar2 - 0x30U)) goto LAB_001a89df;
      lVar4 = lVar4 + -1;
      pcVar2 = pcVar2 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)end - (long)pcVar1;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pcVar2 = end;
      if ((lVar4 != 3) || (pcVar2 = pcVar1, 9 < (byte)(*pcVar1 - 0x30U))) goto LAB_001a89df;
      pcVar1 = pcVar1 + 1;
    }
    pcVar2 = pcVar1;
    if (9 < (byte)(*pcVar1 - 0x30U)) goto LAB_001a89df;
    pcVar1 = pcVar1 + 1;
  }
  pcVar2 = pcVar1;
  if ((byte)(*pcVar1 - 0x30U) < 10) {
    pcVar2 = end;
  }
LAB_001a89df:
  if ((uVar3 != 0 && pcVar2 == end) && (n = ReadDigits(this,begin,end,0x32a), 0 < n)) {
    MultiplyByTenToTheNth(this,n);
    return;
  }
  return;
}

Assistant:

explicit BigUnsigned(absl::string_view sv) : size_(0), words_{} {
    // Check for valid input, returning a 0 otherwise.  This is reasonable
    // behavior only because this constructor is for unit tests.
    if (std::find_if_not(sv.begin(), sv.end(), ascii_isdigit) != sv.end() ||
        sv.empty()) {
      return;
    }
    int exponent_adjust =
        ReadDigits(sv.data(), sv.data() + sv.size(), Digits10() + 1);
    if (exponent_adjust > 0) {
      MultiplyByTenToTheNth(exponent_adjust);
    }
  }